

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall pugi::xml_document::_destroy(xml_document *this)

{
  long lVar1;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  
  if (this->_buffer != (char_t *)0x0) {
    (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              ();
    this->_buffer = (char_t *)0x0;
  }
  pxVar2 = (this->super_xml_node)._root;
  pxVar3 = pxVar2[1].parent;
  if (pxVar3 != (xml_node_struct *)0x0) {
    do {
      if (pxVar3->header != 0) {
        (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                  deallocate)();
      }
      pxVar3 = (xml_node_struct *)pxVar3->name;
    } while (pxVar3 != (xml_node_struct *)0x0);
    pxVar2 = (this->super_xml_node)._root;
  }
  lVar1 = *(long *)((long)pxVar2 + (0x10 - (pxVar2->header >> 8)));
  while (lVar1 != 0) {
    lVar1 = *(long *)(lVar1 + 0x10);
    (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              ();
  }
  (this->super_xml_node)._root = (xml_node_struct *)0x0;
  return;
}

Assistant:

PUGI_IMPL_FN void xml_document::_destroy()
	{
		assert(_root);

		// destroy static storage
		if (_buffer)
		{
			impl::xml_memory::deallocate(_buffer);
			_buffer = NULL;
		}

		// destroy extra buffers (note: no need to destroy linked list nodes, they're allocated using document allocator)
		for (impl::xml_extra_buffer* extra = static_cast<impl::xml_document_struct*>(_root)->extra_buffers; extra; extra = extra->next)
		{
			if (extra->buffer) impl::xml_memory::deallocate(extra->buffer);
		}

		// destroy dynamic storage, leave sentinel page (it's in static memory)
		impl::xml_memory_page* root_page = PUGI_IMPL_GETPAGE(_root);
		assert(root_page && !root_page->prev);
		assert(reinterpret_cast<char*>(root_page) >= _memory && reinterpret_cast<char*>(root_page) < _memory + sizeof(_memory));

		for (impl::xml_memory_page* page = root_page->next; page; )
		{
			impl::xml_memory_page* next = page->next;

			impl::xml_allocator::deallocate_page(page);

			page = next;
		}

	#ifdef PUGIXML_COMPACT
		// destroy hash table
		static_cast<impl::xml_document_struct*>(_root)->hash.clear();
	#endif

		_root = NULL;
	}